

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space.cpp
# Opt level: O3

void init_protos(void)

{
  Am_Slot_Key AVar1;
  char cVar2;
  ushort uVar3;
  ushort uVar4;
  char *pcVar5;
  Am_Constraint *pAVar6;
  Am_Object *pAVar7;
  Am_Wrapper *pAVar8;
  undefined8 uVar9;
  Am_Object AVar10;
  Am_Object AVar11;
  Am_Object AStack_48;
  Am_Object local_40;
  Am_Object local_38;
  Am_Object local_30;
  Am_Object local_28;
  Am_Object local_20;
  
  pcVar5 = (char *)Am_Merge_Pathname("images/ent.gif");
  Am_Image_Array::Am_Image_Array((Am_Image_Array *)&AStack_48,pcVar5);
  Am_Image_Array::operator=((Am_Image_Array *)&SP_Federation_Image,(Am_Image_Array *)&AStack_48);
  Am_Image_Array::~Am_Image_Array((Am_Image_Array *)&AStack_48);
  if (pcVar5 != (char *)0x0) {
    operator_delete__(pcVar5);
  }
  cVar2 = Am_Image_Array::Valid();
  if (cVar2 == '\0') {
    Am_Error("Federation image not found");
  }
  else {
    pcVar5 = (char *)Am_Merge_Pathname("images/kling.gif");
    Am_Image_Array::Am_Image_Array((Am_Image_Array *)&AStack_48,pcVar5);
    Am_Image_Array::operator=((Am_Image_Array *)&SP_Klingon_Image,(Am_Image_Array *)&AStack_48);
    Am_Image_Array::~Am_Image_Array((Am_Image_Array *)&AStack_48);
    if (pcVar5 != (char *)0x0) {
      operator_delete__(pcVar5);
    }
    cVar2 = Am_Image_Array::Valid();
    if (cVar2 != '\0') {
      Am_Object::Create((char *)&AStack_48);
      uVar3 = Am_Object::Add((ushort)&AStack_48,(uint)SHIP_TYPE,2);
      pAVar6 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)&Am_Width_Of_Parts);
      uVar3 = Am_Object::Set(uVar3,(Am_Constraint *)0x66,(ulong)pAVar6);
      pAVar6 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)&Am_Height_Of_Parts);
      uVar3 = Am_Object::Set(uVar3,(Am_Constraint *)0x67,(ulong)pAVar6);
      AVar1 = SHIP_BITMAP;
      Am_Object::Create((char *)&local_30);
      uVar4 = Am_Object::Set((ushort)&local_30,100,0);
      uVar4 = Am_Object::Set(uVar4,0x65,0);
      pAVar6 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)ship_image);
      uVar4 = Am_Object::Set(uVar4,(Am_Constraint *)0xb0,(ulong)pAVar6);
      pAVar6 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)ship_color);
      uVar4 = Am_Object::Set(uVar4,(Am_Constraint *)0x6b,(ulong)pAVar6);
      pAVar7 = (Am_Object *)Am_Object::Set(uVar4,true,1);
      Am_Object::Am_Object(&local_28,pAVar7);
      AVar10.data._2_6_ = 0;
      AVar10.data._0_2_ = AVar1;
      uVar3 = Am_Object::Add_Part(uVar3,AVar10,(ulong)&local_28);
      AVar1 = SHIP_LABEL;
      Am_Object::Create((char *)&local_40);
      pAVar6 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)ship_label_left);
      uVar4 = Am_Object::Set((ushort)&local_40,(Am_Constraint *)0x64,(ulong)pAVar6);
      pAVar6 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)ship_label_top);
      uVar4 = Am_Object::Set(uVar4,(Am_Constraint *)0x65,(ulong)pAVar6);
      uVar4 = Am_Object::Set(uVar4,(char *)0xab,0x10a488);
      pAVar8 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_White);
      pAVar7 = (Am_Object *)Am_Object::Set(uVar4,(Am_Wrapper *)0x6b,(ulong)pAVar8);
      Am_Object::Am_Object(&local_38,pAVar7);
      AVar11.data._2_6_ = 0;
      AVar11.data._0_2_ = AVar1;
      pAVar7 = (Am_Object *)Am_Object::Add_Part(uVar3,AVar11,(ulong)&local_38);
      Am_Object::operator=(&SP_Ship,pAVar7);
      Am_Object::~Am_Object(&local_38);
      Am_Object::~Am_Object(&local_40);
      Am_Object::~Am_Object(&local_28);
      Am_Object::~Am_Object(&local_30);
      Am_Object::~Am_Object(&AStack_48);
      Am_Object::Create((char *)&AStack_48);
      uVar3 = Am_Object::Set((ushort)&AStack_48,true,0);
      pAVar8 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&SP_Tractor_Beam_Style);
      pAVar7 = (Am_Object *)Am_Object::Set(uVar3,(Am_Wrapper *)0x6b,(ulong)pAVar8);
      Am_Object::operator=(&SP_Tractor_Beam,pAVar7);
      Am_Object::~Am_Object(&AStack_48);
      Am_Object::Am_Object(&local_20,&SP_Tractor_Beam);
      Am_Object::Add_Part((Am_Object)0x10e3d0,SUB81(&local_20,0),1);
      Am_Object::~Am_Object(&local_20);
      return;
    }
  }
  uVar9 = Am_Error("Klingon image not found");
  Am_Object::~Am_Object(&local_20);
  _Unwind_Resume(uVar9);
}

Assistant:

void
init_protos()
{

  const char *federation_image_file = Am_Merge_Pathname(IMFN_FEDERATION);
  SP_Federation_Image = Am_Image_Array(federation_image_file);
  delete[] federation_image_file;
  if (!SP_Federation_Image.Valid())
    Am_Error("Federation image not found");

  const char *klingon_image_file = Am_Merge_Pathname(IMFN_KLINGON);
  SP_Klingon_Image = Am_Image_Array(klingon_image_file);
  delete[] klingon_image_file;
  if (!SP_Klingon_Image.Valid())
    Am_Error("Klingon image not found");

  SP_Ship = Am_Group.Create("SP_Ship")
                .Add(SHIP_TYPE, KLINGON) // Set in instances of SP_Ship
                .Set(Am_WIDTH, Am_Width_Of_Parts)
                .Set(Am_HEIGHT, Am_Height_Of_Parts)
                .Add_Part(SHIP_BITMAP, Am_Bitmap.Create("SP_Ship_Bitmap")
                                           .Set(Am_LEFT, 0)
                                           .Set(Am_TOP, 0)
                                           .Set(Am_IMAGE, (ship_image))
                                           .Set(Am_LINE_STYLE, (ship_color))
                                           .Set(Am_DRAW_MONOCHROME, true))
                .Add_Part(SHIP_LABEL, Am_Text.Create("SP_Ship_Label")
                                          .Set(Am_LEFT, (ship_label_left))
                                          .Set(Am_TOP, (ship_label_top))
                                          .Set(Am_TEXT, "Label")
                                          .Set(Am_LINE_STYLE, Am_White));

  SP_Tractor_Beam = Am_Line.Create("SP_Tractor_Beam")
                        .Set(Am_VISIBLE, false) // Set by interactor
                        .Set(Am_LINE_STYLE, SP_Tractor_Beam_Style);
  SP_Clip_Win.Add_Part(SP_Tractor_Beam);
}